

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O2

double Gudhi::Persistence_representations::compute_distance_of_landscapes
                 (Persistence_landscape *first,Persistence_landscape *second,double p)

{
  Persistence_landscape *in_RCX;
  double dVar1;
  Persistence_landscape lan;
  Persistence_landscape local_58;
  Persistence_landscape local_30;
  
  operation_on_pair_of_landscapes<std::minus<double>>
            (&local_58,(Persistence_representations *)first,second,in_RCX);
  Persistence_landscape::abs(&local_30,(int)&local_58);
  Persistence_landscape::operator=(&local_58,&local_30);
  std::
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ::~vector(&local_30.land);
  if (1.79769313486232e+308 <= p) {
    dVar1 = Persistence_landscape::compute_maximum(&local_58);
  }
  else {
    if ((p != 1.0) || (NAN(p))) {
      dVar1 = Persistence_landscape::compute_integral_of_landscape(&local_58,p);
    }
    else {
      dVar1 = Persistence_landscape::compute_integral_of_landscape(&local_58);
    }
    dVar1 = pow(dVar1,1.0 / p);
  }
  std::
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ::~vector(&local_58.land);
  return dVar1;
}

Assistant:

double compute_distance_of_landscapes(const Persistence_landscape& first, const Persistence_landscape& second,
                                      double p) {
  bool dbg = false;
  // This is what we want to compute: (\int_{- \infty}^{+\infty}| first-second |^p)^(1/p). We will do it one step at a
  // time:

  // first-second :
  Persistence_landscape lan = first - second;

  //| first-second |:
  lan = lan.abs();

  if (dbg) {
    std::clog << "Abs of difference ; " << lan << std::endl;
    getchar();
  }

  if (p < std::numeric_limits<double>::max()) {
    // \int_{- \infty}^{+\infty}| first-second |^p
    double result;
    if (p != 1) {
      if (dbg) std::clog << "Power != 1, compute integral to the power p\n";
      result = lan.compute_integral_of_landscape(p);
    } else {
      if (dbg) std::clog << "Power = 1, compute integral \n";
      result = lan.compute_integral_of_landscape();
    }
    // (\int_{- \infty}^{+\infty}| first-second |^p)^(1/p)
    return pow(result, 1.0 / p);
  } else {
    // p == infty
    if (dbg) std::clog << "Power = infty, compute maximum \n";
    return lan.compute_maximum();
  }
}